

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcoluk.c
# Opt level: O0

int fffstruint(char *input,long ntodo,double scale,double zero,long twidth,double implipower,
              int nullcheck,char *snull,uint nullval,char *nullarray,int *anynull,uint *output,
              int *status)

{
  char cVar1;
  bool bVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  size_t sVar6;
  char *pcVar7;
  int in_ECX;
  long in_RDX;
  long in_RSI;
  char *in_RDI;
  char *in_R8;
  undefined4 in_R9D;
  double in_XMM0_Qa;
  double dVar8;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  long in_stack_00000008;
  undefined4 *in_stack_00000010;
  int decpt;
  int esign;
  int sign;
  int exponent;
  double power;
  double val;
  char chrzero;
  char tempstore;
  char *tpos;
  char *cptr;
  char message [81];
  char *cstring;
  double dvalue;
  long ii;
  int nullen;
  int local_fc;
  int local_f8;
  int local_f4;
  double local_f0;
  double local_e8;
  char *local_d0;
  char local_c8 [96];
  char *local_68;
  double local_60;
  long local_58;
  int local_50;
  undefined4 local_4c;
  char *local_48;
  int local_3c;
  double local_38;
  long local_30;
  double local_28;
  double local_20;
  long local_18;
  char *local_10;
  
  local_4c = in_R9D;
  local_48 = in_R8;
  local_3c = in_ECX;
  local_38 = in_XMM2_Qa;
  local_30 = in_RDX;
  local_28 = in_XMM1_Qa;
  local_20 = in_XMM0_Qa;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sVar6 = strlen(in_R8);
  local_50 = (int)sVar6;
  local_d0 = local_10;
  local_58 = 0;
  do {
    if (local_18 <= local_58) {
      return *_sign;
    }
    local_68 = local_d0;
    pcVar7 = local_d0 + local_30;
    cVar1 = *pcVar7;
    *pcVar7 = '\0';
    if ((*local_48 == '\x01') || (iVar5 = strncmp(local_48,local_d0,(long)local_50), iVar5 != 0)) {
      bVar4 = false;
      local_f8 = 1;
      local_e8 = 0.0;
      local_f0 = 1.0;
      local_f4 = 0;
      local_fc = 1;
      for (; *local_d0 == ' '; local_d0 = local_d0 + 1) {
      }
      if ((*local_d0 == '-') || (*local_d0 == '+')) {
        if (*local_d0 == '-') {
          local_f8 = -1;
        }
        do {
          local_d0 = local_d0 + 1;
        } while (*local_d0 == ' ');
      }
      while( true ) {
        bVar2 = false;
        if ('/' < *local_d0) {
          bVar2 = *local_d0 < ':';
        }
        if (!bVar2) break;
        local_e8 = (local_e8 * 10.0 + (double)(int)*local_d0) - 48.0;
        do {
          local_d0 = local_d0 + 1;
        } while (*local_d0 == ' ');
      }
      if ((*local_d0 == '.') || (*local_d0 == ',')) {
        bVar4 = true;
        do {
          local_d0 = local_d0 + 1;
        } while (*local_d0 == ' ');
        while( true ) {
          bVar2 = false;
          if ('/' < *local_d0) {
            bVar2 = *local_d0 < ':';
          }
          if (!bVar2) break;
          local_e8 = (local_e8 * 10.0 + (double)(int)*local_d0) - 48.0;
          local_f0 = local_f0 * 10.0;
          do {
            local_d0 = local_d0 + 1;
          } while (*local_d0 == ' ');
        }
      }
      if ((*local_d0 == 'E') || (*local_d0 == 'D')) {
        do {
          pcVar3 = local_d0;
          local_d0 = pcVar3 + 1;
        } while (*local_d0 == ' ');
        if ((*local_d0 == '-') || (*local_d0 == '+')) {
          if (*local_d0 == '-') {
            local_fc = -1;
          }
          for (local_d0 = pcVar3 + 2; *local_d0 == ' '; local_d0 = local_d0 + 1) {
          }
        }
        while( true ) {
          bVar2 = false;
          if ('/' < *local_d0) {
            bVar2 = *local_d0 < ':';
          }
          if (!bVar2) break;
          local_f4 = local_f4 * 10 + (int)*local_d0 + -0x30;
          do {
            local_d0 = local_d0 + 1;
          } while (*local_d0 == ' ');
        }
      }
      if (*local_d0 != '\0') {
        snprintf(local_c8,0x51,"Cannot read number from ASCII table");
        ffpmsg((char *)0x1db72a);
        snprintf(local_c8,0x51,"Column field = %s.",local_68);
        ffpmsg((char *)0x1db754);
        *pcVar7 = cVar1;
        *_sign = 0x199;
        return 0x199;
      }
      if (!bVar4) {
        local_f0 = local_38;
      }
      dVar8 = pow(10.0,(double)(local_fc * local_f4));
      local_60 = (((double)local_f8 * local_e8) / local_f0) * dVar8 * local_20 + local_28;
      if (-0.49 <= local_60) {
        if (local_60 <= 4294967295.49) {
          *(int *)(_decpt + local_58 * 4) = (int)(long)local_60;
        }
        else {
          *_sign = -0xb;
          *(undefined4 *)(_decpt + local_58 * 4) = 0xffffffff;
        }
      }
      else {
        *_sign = -0xb;
        *(undefined4 *)(_decpt + local_58 * 4) = 0;
      }
    }
    else {
      if (local_3c != 0) {
        *in_stack_00000010 = 1;
        if (local_3c == 1) {
          *(undefined4 *)(_decpt + local_58 * 4) = local_4c;
        }
        else {
          *(undefined1 *)(in_stack_00000008 + local_58) = 1;
        }
      }
      local_d0 = local_d0 + local_30;
    }
    *pcVar7 = cVar1;
    local_58 = local_58 + 1;
  } while( true );
}

Assistant:

int fffstruint(char *input,        /* I - array of values to be converted     */
            long ntodo,           /* I - number of elements in the array     */
            double scale,         /* I - FITS TSCALn or BSCALE value         */
            double zero,          /* I - FITS TZEROn or BZERO  value         */
            long twidth,          /* I - width of each substring of chars    */
            double implipower,    /* I - power of 10 of implied decimal      */
            int nullcheck,        /* I - null checking code; 0 = don't check */
                                  /*     1:set null pixels = nullval         */
                                  /*     2: if null pixel, set nullarray = 1 */
            char  *snull,         /* I - value of FITS null string, if any   */
   unsigned int nullval,          /* I - set null pixels, if nullcheck = 1   */
            char *nullarray,      /* I - bad pixel array, if nullcheck = 2   */
            int  *anynull,        /* O - set to 1 if any pixels are null     */
   unsigned int *output,          /* O - array of converted pixels           */
            int *status)          /* IO - error status                       */
/*
  Copy input to output following reading of the input from a FITS file. Check
  for null values and do scaling if required. The nullcheck code value
  determines how any null values in the input array are treated. A null
  value is an input pixel that is equal to snull.  If nullcheck= 0, then
  no special checking for nulls is performed.  If nullcheck = 1, then the
  output pixel will be set = nullval if the corresponding input pixel is null.
  If nullcheck = 2, then if the pixel is null then the corresponding value of
  nullarray will be set to 1; the value of nullarray for non-null pixels 
  will = 0.  The anynull parameter will be set = 1 if any of the returned
  pixels are null, otherwise anynull will be returned with a value = 0;
*/
{
    int nullen;
    long ii;
    double dvalue;
    char *cstring, message[FLEN_ERRMSG];
    char *cptr, *tpos;
    char tempstore, chrzero = '0';
    double val, power;
    int exponent, sign, esign, decpt;

    nullen = strlen(snull);
    cptr = input;  /* pointer to start of input string */
    for (ii = 0; ii < ntodo; ii++)
    {
      cstring = cptr;
      /* temporarily insert a null terminator at end of the string */
      tpos = cptr + twidth;
      tempstore = *tpos;
      *tpos = 0;

      /* check if null value is defined, and if the    */
      /* column string is identical to the null string */
      if (snull[0] != ASCII_NULL_UNDEFINED && 
         !strncmp(snull, cptr, nullen) )
      {
        if (nullcheck)  
        {
          *anynull = 1;    
          if (nullcheck == 1)
            output[ii] = nullval;
          else
            nullarray[ii] = 1;
        }
        cptr += twidth;
      }
      else
      {
        /* value is not the null value, so decode it */
        /* remove any embedded blank characters from the string */

        decpt = 0;
        sign = 1;
        val  = 0.;
        power = 1.;
        exponent = 0;
        esign = 1;

        while (*cptr == ' ')               /* skip leading blanks */
           cptr++;

        if (*cptr == '-' || *cptr == '+')  /* check for leading sign */
        {
          if (*cptr == '-')
             sign = -1;

          cptr++;

          while (*cptr == ' ')         /* skip blanks between sign and value */
            cptr++;
        }

        while (*cptr >= '0' && *cptr <= '9')
        {
          val = val * 10. + *cptr - chrzero;  /* accumulate the value */
          cptr++;

          while (*cptr == ' ')         /* skip embedded blanks in the value */
            cptr++;
        }

        if (*cptr == '.' || *cptr == ',')       /* check for decimal point */
        {
          decpt = 1;       /* set flag to show there was a decimal point */
          cptr++;
          while (*cptr == ' ')         /* skip any blanks */
            cptr++;

          while (*cptr >= '0' && *cptr <= '9')
          {
            val = val * 10. + *cptr - chrzero;  /* accumulate the value */
            power = power * 10.;
            cptr++;

            while (*cptr == ' ')         /* skip embedded blanks in the value */
              cptr++;
          }
        }

        if (*cptr == 'E' || *cptr == 'D')  /* check for exponent */
        {
          cptr++;
          while (*cptr == ' ')         /* skip blanks */
              cptr++;
  
          if (*cptr == '-' || *cptr == '+')  /* check for exponent sign */
          {
            if (*cptr == '-')
               esign = -1;

            cptr++;

            while (*cptr == ' ')        /* skip blanks between sign and exp */
              cptr++;
          }

          while (*cptr >= '0' && *cptr <= '9')
          {
            exponent = exponent * 10 + *cptr - chrzero;  /* accumulate exp */
            cptr++;

            while (*cptr == ' ')         /* skip embedded blanks */
              cptr++;
          }
        }

        if (*cptr  != 0)  /* should end up at the null terminator */
        {
          snprintf(message, FLEN_ERRMSG,"Cannot read number from ASCII table");
          ffpmsg(message);
          snprintf(message, FLEN_ERRMSG,"Column field = %s.", cstring);
          ffpmsg(message);
          /* restore the char that was overwritten by the null */
          *tpos = tempstore;
          return(*status = BAD_C2D);
        }

        if (!decpt)  /* if no explicit decimal, use implied */
           power = implipower;

        dvalue = (sign * val / power) * pow(10., (double) (esign * exponent));

        dvalue = dvalue * scale + zero;   /* apply the scaling */

        if (dvalue < DUINT_MIN)
        {
            *status = OVERFLOW_ERR;
            output[ii] = 0;
        }
        else if (dvalue > DUINT_MAX)
        {
            *status = OVERFLOW_ERR;
            output[ii] = UINT_MAX;
        }
        else
            output[ii] = (long) dvalue;
      }
      /* restore the char that was overwritten by the null */
      *tpos = tempstore;
    }
    return(*status);
}